

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O3

void __thiscall wasm::StringLowering::updateTypes(StringLowering *this,Module *module)

{
  pointer *ppHVar1;
  undefined1 auVar2 [8];
  int iVar3;
  pointer pHVar4;
  bool bVar5;
  FeatureSet FVar6;
  Shareability SVar7;
  HeapTypeKind HVar8;
  size_t sVar9;
  Type *pTVar10;
  Type *pTVar11;
  HeapType HVar12;
  Type TVar13;
  mapped_type *pmVar14;
  undefined1 auVar15 [8];
  pointer puVar16;
  optional<wasm::HeapType> oVar17;
  undefined1 auStack_188 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_118;
  Signature local_e0;
  StringLowering *local_d0;
  undefined1 auStack_c8 [8];
  TypeUpdates updates;
  HeapType local_88;
  Type local_80;
  pointer local_78;
  undefined1 local_70 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> allTypes;
  Iterator __begin3;
  Type local_38;
  HeapType array16;
  
  puVar16 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = this;
  updates._M_h._M_single_bucket = (__node_base_ptr)module;
  if (puVar16 != local_78) {
    ppHVar1 = &allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    do {
      auStack_188 = (undefined1  [8])
                    HeapType::getRecGroup
                              (&((puVar16->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type
                              );
      sVar9 = RecGroup::size((RecGroup *)auStack_188);
      if ((sVar9 == 1) &&
         (FVar6 = HeapType::getFeatures
                            (&((puVar16->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type),
         (FVar6.features >> 0xe & 1) != 0)) {
        auStack_188 = (undefined1  [8])0x0;
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        updates._M_h._M_bucket_count = 0;
        auStack_c8 = (undefined1  [8])0x0;
        updates._M_h._M_buckets = (__buckets_ptr)0x0;
        _local_70 = HeapType::getSignature
                              (&((puVar16->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type
                              );
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_70;
        pTVar10 = (Type *)wasm::Type::size((Type *)local_70);
        if (pTVar10 == (Type *)0x0) goto LAB_00a5bdb4;
        do {
          do {
            pTVar11 = wasm::Type::Iterator::operator*((Iterator *)ppHVar1);
            local_38.id = pTVar11->id;
            TVar13.id = local_38.id;
            if (((local_38.id & 1) == 0 && (__node_base_ptr)0x6 < local_38.id) &&
               (HVar12 = wasm::Type::getHeapType(&local_38), TVar13.id = local_38.id,
               HVar12.id < 0x7d && ((uint)HVar12.id & 0x7b) == 0x50)) {
              local_88 = wasm::Type::getHeapType(&local_38);
              SVar7 = HeapType::getShared(&local_88);
              TVar13.id = (uintptr_t)
                          ((ulong)((uint)(((uint)local_38.id & 3) == 2 &&
                                         (__node_base_ptr)0x6 < local_38.id) * 2 +
                                  (uint)(SVar7 == Shared) * 4) | 8);
            }
            local_80.id = TVar13.id;
            if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start ==
                params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_188,
                         (iterator)
                         params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                         super__Vector_impl_data._M_start,&local_80);
            }
            else {
              (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->id = (uintptr_t)TVar13;
              params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start =
                   params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
          } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent != pTVar10);
LAB_00a5bdb4:
        } while (allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_70);
        _local_70 = HeapType::getSignature
                              (&((puVar16->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type
                              );
        allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&allTypes;
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        pTVar10 = (Type *)wasm::Type::size((Type *)allTypes.
                                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
        if ((pTVar10 != (Type *)0x0) ||
           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
            allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != &allTypes)) {
          do {
            pTVar11 = wasm::Type::Iterator::operator*((Iterator *)ppHVar1);
            local_38.id = pTVar11->id;
            TVar13.id = local_38.id;
            if (((local_38.id & 1) == 0 && (__node_base_ptr)0x6 < local_38.id) &&
               (HVar12 = wasm::Type::getHeapType(&local_38), TVar13.id = local_38.id,
               HVar12.id < 0x7d && ((uint)HVar12.id & 0x7b) == 0x50)) {
              local_88 = wasm::Type::getHeapType(&local_38);
              SVar7 = HeapType::getShared(&local_88);
              TVar13.id = (uintptr_t)
                          ((ulong)((uint)(((uint)local_38.id & 3) == 2 &&
                                         (__node_base_ptr)0x6 < local_38.id) * 2 +
                                  (uint)(SVar7 == Shared) * 4) | 8);
            }
            local_80.id = TVar13.id;
            if (updates._M_h._M_buckets == (__buckets_ptr)updates._M_h._M_bucket_count) {
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_c8,
                         (iterator)updates._M_h._M_buckets,&local_80);
            }
            else {
              *updates._M_h._M_buckets = (__node_base_ptr)TVar13.id;
              updates._M_h._M_buckets = updates._M_h._M_buckets + 1;
            }
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
          } while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent != pTVar10) ||
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage != &allTypes));
        }
        wasm::Type::Type(&local_e0.params,(Tuple *)auStack_188);
        wasm::Type::Type(&local_e0.results,(Tuple *)auStack_c8);
        HeapType::HeapType((HeapType *)local_70,local_e0);
        (((puVar16->_M_t).
          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type).id =
             (uintptr_t)local_70;
        if (auStack_c8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_c8,updates._M_h._M_bucket_count - (long)auStack_c8);
        }
        if (auStack_188 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_188,
                          (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)auStack_188);
        }
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != local_78);
  }
  auStack_c8 = (undefined1  [8])&updates._M_h._M_rehash_policy._M_next_resize;
  updates._M_h._M_buckets = (__buckets_ptr)0x1;
  updates._M_h._M_bucket_count = 0;
  updates._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  updates._M_h._M_element_count._0_4_ = 0x3f800000;
  updates._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  updates._M_h._M_rehash_policy._4_4_ = 0;
  updates._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_188 = (undefined1  [8])0x50;
  pmVar14 = std::__detail::
            _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)auStack_c8,(key_type *)auStack_188);
  pmVar14->id = 8;
  wasm::ModuleUtils::collectHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_70,
             (Module *)updates._M_h._M_single_bucket);
  local_38.id = (uintptr_t)wasm::Type::getHeapType(&local_d0->nullArray16);
  HeapType::getArray((HeapType *)auStack_188);
  auVar2 = auStack_188;
  pHVar4 = allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_70 !=
      (undefined1  [8])
      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar3 = (int)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_78 = (pointer)CONCAT44(local_78._4_4_,
                                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_);
    ppHVar1 = &allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    auVar15 = local_70;
    do {
      allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((pointer)auVar15)->id;
      HVar8 = HeapType::getKind((HeapType *)ppHVar1);
      if ((((HVar8 == Array) &&
           (oVar17 = HeapType::getDeclaredSuperType((HeapType *)ppHVar1),
           ((undefined1  [16])
            oVar17.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0)) && (bVar5 = HeapType::isOpen((HeapType *)ppHVar1), !bVar5)) &&
         ((HeapType::getArray((HeapType *)auStack_188), auStack_188 == auVar2 &&
          ((int)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start == iVar3)))) {
        if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ == (int)local_78) {
          pmVar14 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_c8,(key_type *)ppHVar1);
          pmVar14->id = local_38.id;
        }
      }
      auVar15 = (undefined1  [8])((long)auVar15 + 8);
    } while (auVar15 != (undefined1  [8])pHVar4);
  }
  GlobalTypeRewriter::GlobalTypeRewriter
            ((GlobalTypeRewriter *)auStack_188,(Module *)updates._M_h._M_single_bucket);
  auStack_188 = (undefined1  [8])&PTR__TypeMapper_01071678;
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_bucket_count = 1;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TypeMapper::map((TypeMapper *)auStack_188,
                  (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                  &allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    -(long)allTypes.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  auStack_188 = (undefined1  [8])&PTR__TypeMapper_01071678;
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_118);
  GlobalTypeRewriter::~GlobalTypeRewriter((GlobalTypeRewriter *)auStack_188);
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70,
                    (long)allTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_70);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_c8);
  return;
}

Assistant:

void updateTypes(Module* module) {
    // TypeMapper will not handle public types, but we do want to modify them as
    // well: we are modifying the public ABI here. We can't simply tell
    // TypeMapper to consider them private, as then they'd end up in the new big
    // rec group with the private types (and as they are public, that would make
    // the entire rec group public, and all types in the module with it).
    // Instead, manually handle singleton-rec groups of function types. This
    // keeps them at size 1, as expected, and handles the cases of function
    // imports and exports. If we need more (non-function types, non-singleton
    // rec groups, etc.) then more work will be necessary TODO
    //
    // Note that we do this before TypeMapper, which allows it to then fix up
    // things like the types of parameters (which depend on the type of the
    // function, which must be modified either in TypeMapper - but as just
    // explained we cannot do that - or before it, which is what we do here).
    for (auto& func : module->functions) {
      if (func->type.getRecGroup().size() != 1 ||
          !func->type.getFeatures().hasStrings()) {
        continue;
      }

      // Fix up the stringrefs in this type that uses strings and is in a
      // singleton rec group.
      std::vector<Type> params, results;
      auto fix = [](Type t) {
        if (t.isRef() && t.getHeapType().isMaybeShared(HeapType::string)) {
          auto share = t.getHeapType().getShared();
          t = Type(HeapTypes::ext.getBasic(share), t.getNullability());
        }
        return t;
      };
      for (auto param : func->type.getSignature().params) {
        params.push_back(fix(param));
      }
      for (auto result : func->type.getSignature().results) {
        results.push_back(fix(result));
      }
      func->type = Signature(params, results);
    }

    TypeMapper::TypeUpdates updates;

    // Strings turn into externref.
    updates[HeapType::string] = HeapType::ext;

    // The module may have its own array16 type inside a big rec group, but
    // imported strings expects that type in its own rec group as part of the
    // ABI. Fix that up here. (This is valid to do as this type has no sub- or
    // super-types anyhow; it is "plain old data" for communicating with the
    // outside.)
    auto allTypes = ModuleUtils::collectHeapTypes(*module);
    auto array16 = nullArray16.getHeapType();
    auto array16Element = array16.getArray().element;
    for (auto type : allTypes) {
      // Match an array type with no super and that is closed.
      if (type.isArray() && !type.getDeclaredSuperType() && !type.isOpen() &&
          type.getArray().element == array16Element) {
        updates[type] = array16;
      }
    }

    TypeMapper(*module, updates).map();
  }